

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLLinOp::defineGrids
          (MLLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory)

{
  pointer *ppIVar1;
  int *piVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  iterator iVar6;
  pointer ppFVar7;
  pointer pGVar8;
  vector<amrex::Geometry,std::allocator<amrex::Geometry>> *pvVar9;
  iterator iVar10;
  BATransformer *this_00;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pvVar11;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *pvVar12;
  pointer pDVar13;
  pointer pDVar14;
  long *plVar15;
  pointer pVVar16;
  iterator iVar17;
  pointer pVVar18;
  char cVar19;
  bool bVar20;
  undefined8 uVar21;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Var22;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var23;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  *pVVar24;
  undefined8 uVar25;
  bool bVar26;
  int i;
  uint uVar27;
  IndexType IVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  Geometry *pGVar32;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar33;
  Long LVar34;
  uint *puVar35;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar36;
  ostream *poVar37;
  pointer piVar38;
  int iVar39;
  int iVar40;
  Vector<int,_std::allocator<int>_> *pVVar41;
  byte bVar42;
  int idim_1;
  pointer pVVar43;
  uint uVar44;
  ulong uVar45;
  int iVar46;
  int dir;
  int iVar47;
  long lVar48;
  int dir_1;
  vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
  *pvVar49;
  long lVar50;
  int idim;
  bool bVar51;
  double dVar52;
  initializer_list<amrex::Box> __l;
  initializer_list<amrex::Box> __l_00;
  initializer_list<int> __l_01;
  initializer_list<amrex::IntVect> __l_02;
  IntVect rr;
  IntVect rr_vec;
  IntVect mg_coarsen_ratio_v;
  IntVect rr_level_1;
  IntVect is_coarsenable_1;
  int coord;
  IntVect rr_level;
  IntVect is_coarsenable;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> accum_coarsen_ratio;
  IntVect mg_box_min_width_v;
  Vector<int,_std::allocator<int>_> agg_flag;
  IntVect mg_domain_min_width_v;
  Box result;
  Box local_368;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_348;
  IndexType IStack_340;
  uint auStack_33c [3];
  IndexType IStack_330;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  *local_320;
  uint local_318;
  undefined8 local_314;
  uint local_30c;
  ulong local_308;
  double local_300;
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  *local_2f8;
  Vector<int,_std::allocator<int>_> *local_2f0;
  IntVect local_2e8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_2d8;
  IntVect local_2cc;
  undefined8 local_2c0;
  long local_2b8;
  CoordType local_2ac;
  double local_2a8;
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_2a0;
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_288;
  long local_270;
  long local_268;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *local_260;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  *local_258;
  pointer local_250;
  Box local_248;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_228;
  IntVect local_20c;
  vector<int,_std::allocator<int>_> local_200;
  array<int,_3UL> local_1e8;
  IntVect local_1dc;
  Vector<int,_std::allocator<int>_> *local_1d0;
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  *local_1c8;
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  *local_1c0;
  undefined1 local_1b8 [12];
  int iStack_1ac;
  ostringstream aoStack_1a8 [8];
  undefined8 auStack_1a0 [46];
  
  iVar39 = (int)((long)(a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * -0x3d70a3d7;
  this->m_num_amr_levels = iVar39;
  local_1d0 = &this->m_amr_ref_ratio;
  local_2d8 = a_grids;
  local_260 = a_dmap;
  local_1c0 = a_factory;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_1d0->super_vector<int,_std::allocator<int>_>,(long)iVar39);
  local_2f0 = &this->m_num_mg_levels;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_2f0->super_vector<int,_std::allocator<int>_>,(long)this->m_num_amr_levels);
  local_258 = &this->m_geom;
  std::
  vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::resize(&local_258->
            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ,(long)this->m_num_amr_levels);
  local_320 = &this->m_grids;
  std::
  vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::resize(&local_320->
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           ,(long)this->m_num_amr_levels);
  local_2f8 = &this->m_dmap;
  std::
  vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::resize(&local_2f8->
            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           ,(long)this->m_num_amr_levels);
  local_1c8 = &this->m_factory;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::resize(&local_1c8->
            super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
           ,(long)this->m_num_amr_levels);
  this->m_default_comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  local_250 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2ac = (local_250->super_CoordSys).c_sys;
  local_1e8._M_elems._0_8_ =
       (ulong)(byte)(local_250->super_CoordSys).field_0x52 << 0x20 |
       (ulong)(byte)(local_250->super_CoordSys).field_0x51;
  local_1e8._M_elems[2] = (int)(byte)(local_250->super_CoordSys).field_0x53;
  local_314 = (pointer)0x200000002;
  local_30c = 2;
  local_20c.vect[0] = 2;
  local_20c.vect[1] = 2;
  local_20c.vect[2] = 2;
  local_1dc.vect[0] = 4;
  local_1dc.vect[1] = 4;
  local_1dc.vect[2] = 4;
  uVar44 = (this->info).hidden_direction;
  uVar27 = this->m_num_amr_levels;
  if (uVar44 < 3) {
    bVar51 = uVar27 != 1;
    uVar27 = 1;
    if (bVar51) {
      Assert_host("AMREX_SPACEDIM == 3 && m_num_amr_levels == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                  ,0xcc,"\"Hidden direction only supported for 3d level solve\"");
      uVar44 = (this->info).hidden_direction;
      uVar27 = this->m_num_amr_levels;
    }
    lVar31 = (long)(int)uVar44;
    *(undefined4 *)((long)&local_314 + lVar31 * 4) = 1;
    local_20c.vect[lVar31] = 0;
    local_1dc.vect[lVar31] = 0;
  }
  local_250 = (pointer)&local_250->prob_domain;
  if (1 < (int)uVar27) {
    local_318 = (uint)local_314;
    local_300 = (double)CONCAT44(local_300._4_4_,local_314._4_4_);
    local_2a8 = (double)CONCAT44(local_2a8._4_4_,local_30c);
    uVar33 = (ulong)uVar27;
    do {
      uVar45 = uVar33 - 1;
      (local_2f0->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar33 - 1] = 1;
      pvVar9 = (vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
               ((local_258->
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ).
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar45);
      pGVar32 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                super__Vector_impl_data._M_start + uVar45;
      iVar6._M_current = *(Geometry **)(pvVar9 + 8);
      local_2c0 = uVar33;
      if (iVar6._M_current == *(Geometry **)(pvVar9 + 0x10)) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>(pvVar9,iVar6,pGVar32);
      }
      else {
        memcpy(iVar6._M_current,pGVar32,200);
        *(long *)(pvVar9 + 8) = *(long *)(pvVar9 + 8) + 200;
      }
      local_268 = uVar45 * 0x68;
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
                (&(local_320->
                  super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ).
                  super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar45].
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                 (local_2d8->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar45);
      local_270 = uVar45 * 0x10;
      std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
      push_back(&(local_2f8->
                 super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar45].
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ,(local_260->
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ).
                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar45);
      ppFVar7 = (local_1c0->
                super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ).
                super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar49 = (vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
                 *)((local_1c8->
                    super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    ).
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar45);
      local_308 = uVar45;
      if ((long)(local_1c0->
                super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ).
                super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3 < (long)local_2c0) {
        local_1b8._0_8_ = operator_new(8);
        *(undefined ***)local_1b8._0_8_ = &PTR__FabFactory_00712918;
        std::
        vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
        ::
        emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
                  (pvVar49,(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            *)local_1b8);
        if ((_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             )local_1b8._0_8_ != (FabFactory<amrex::FArrayBox> *)0x0) {
          (**(code **)(*(long *)local_1b8._0_8_ + 8))();
        }
      }
      else {
        local_1b8._0_4_ = (*ppFVar7[uVar45]->_vptr_FabFactory[5])();
        local_1b8._4_4_ = extraout_var;
        iVar10._M_current =
             *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               **)(pvVar49 + 8);
        if (iVar10._M_current ==
            *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              **)(pvVar49 + 0x10)) {
          std::
          vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
          ::_M_realloc_insert<amrex::FabFactory<amrex::FArrayBox>*>
                    (pvVar49,iVar10,(FabFactory<amrex::FArrayBox> **)local_1b8);
        }
        else {
          ((iVar10._M_current)->_M_t).
          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
               (FabFactory<amrex::FArrayBox> *)local_1b8._0_8_;
          *(long *)(pvVar49 + 8) = *(long *)(pvVar49 + 8) + 8;
        }
      }
      local_368.smallend.vect[2] = local_30c;
      local_368.smallend.vect._0_8_ = local_314;
      pGVar8 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_2b8 = local_2c0 * 200;
      bVar51 = true;
      do {
        bVar26 = bVar51;
        local_1b8._0_8_ =
             (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              )0x100000001;
        local_1b8._8_4_ = 1;
        bVar51 = Box::coarsenable(&pGVar8[uVar45].domain,&local_368.smallend,(IntVect *)local_1b8);
        if (!bVar51) {
          Abort_host("MLLinOp: Uncoarsenable domain");
        }
        uVar33 = local_308;
        _Var22._M_t.
        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
             *(tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               *)pGVar8[uVar45].domain.smallend.vect;
        lVar31 = *(long *)(pGVar8[uVar45].domain.smallend.vect + 2);
        lVar50 = *(long *)pGVar8[uVar45].domain.bigend.vect;
        uVar36 = *(undefined8 *)(pGVar8[uVar45].domain.bigend.vect + 2);
        aoStack_1a8._0_4_ = (undefined4)((ulong)lVar50 >> 0x20);
        aoStack_1a8._4_4_ = (undefined4)uVar36;
        auStack_1a0[0]._0_4_ = (undefined4)((ulong)uVar36 >> 0x20);
        local_1b8._8_4_ = (undefined4)lVar31;
        iStack_1ac = (int)((ulong)lVar31 >> 0x20);
        local_1b8._4_4_ =
             _Var22._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl._4_4_
        ;
        IVar28.itype = local_1b8._4_4_;
        uVar44 = aoStack_1a8._4_4_;
        if (local_368.smallend.vect[1] == 1 && local_368.smallend.vect[0] == 1) {
          local_1b8._0_8_ =
               _Var22._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
          if (local_368.smallend.vect[2] != 1) goto LAB_0053b4d2;
        }
        else {
          local_1b8._0_4_ =
               _Var22._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl.
               _0_4_;
          if (local_368.smallend.vect[0] != 1) {
            if (local_368.smallend.vect[0] == 4) {
              if ((int)local_1b8._0_4_ < 0) {
                local_1b8._0_4_ = (int)local_1b8._0_4_ >> 2;
              }
              else {
                local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 2;
              }
            }
            else if (local_368.smallend.vect[0] == 2) {
              if ((int)local_1b8._0_4_ < 0) {
                local_1b8._0_4_ = (int)local_1b8._0_4_ >> 1;
              }
              else {
                local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 1;
              }
            }
            else if ((int)local_1b8._0_4_ < 0) {
              local_1b8._0_4_ = ~((int)~local_1b8._0_4_ / local_368.smallend.vect[0]);
            }
            else {
              local_1b8._0_4_ = (int)local_1b8._0_4_ / local_368.smallend.vect[0];
            }
          }
          if (local_368.smallend.vect[1] != 1) {
            if (local_368.smallend.vect[1] == 4) {
              if ((long)_Var22._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl < 0) {
                IVar28.itype = (int)local_1b8._4_4_ >> 2;
              }
              else {
                IVar28.itype = (uint)local_1b8._4_4_ >> 2;
              }
            }
            else if (local_368.smallend.vect[1] == 2) {
              if ((long)_Var22._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl < 0) {
                IVar28.itype = (int)local_1b8._4_4_ >> 1;
              }
              else {
                IVar28.itype = (uint)local_1b8._4_4_ >> 1;
              }
            }
            else if ((long)_Var22._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl < 0) {
              IVar28.itype = ~((int)~local_1b8._4_4_ / local_368.smallend.vect[1]);
            }
            else {
              IVar28.itype = (int)local_1b8._4_4_ / local_368.smallend.vect[1];
            }
          }
LAB_0053b4d2:
          local_1b8._4_4_ = IVar28.itype;
          if (local_368.smallend.vect[2] != 1) {
            if (local_368.smallend.vect[2] == 4) {
              if ((int)local_1b8._8_4_ < 0) {
                local_1b8._8_4_ = (int)local_1b8._8_4_ >> 2;
              }
              else {
                local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 2;
              }
            }
            else if (local_368.smallend.vect[2] == 2) {
              if ((int)local_1b8._8_4_ < 0) {
                local_1b8._8_4_ = (int)local_1b8._8_4_ >> 1;
              }
              else {
                local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 1;
              }
            }
            else if ((int)local_1b8._8_4_ < 0) {
              local_1b8._8_4_ = ~((int)~local_1b8._8_4_ / local_368.smallend.vect[2]);
            }
            else {
              local_1b8._8_4_ = (int)local_1b8._8_4_ / local_368.smallend.vect[2];
            }
          }
          if ((undefined4)auStack_1a0[0] == 0) {
            uVar27 = iStack_1ac;
            if (local_368.smallend.vect[0] != 1) {
              if (local_368.smallend.vect[0] == 4) {
                uVar27 = iStack_1ac >> 2;
                if (-1 < lVar31) {
                  uVar27 = (uint)iStack_1ac >> 2;
                }
              }
              else if (local_368.smallend.vect[0] == 2) {
                uVar27 = iStack_1ac >> 1;
                if (-1 < lVar31) {
                  uVar27 = (uint)iStack_1ac >> 1;
                }
              }
              else if (lVar31 < 0) {
                uVar27 = ~(~iStack_1ac / local_368.smallend.vect[0]);
              }
              else {
                uVar27 = iStack_1ac / local_368.smallend.vect[0];
              }
            }
            uVar29 = aoStack_1a8._0_4_;
            if (local_368.smallend.vect[1] != 1) {
              if (local_368.smallend.vect[1] == 4) {
                uVar29 = (int)aoStack_1a8._0_4_ >> 2;
                if (-1 < lVar50) {
                  uVar29 = (uint)aoStack_1a8._0_4_ >> 2;
                }
              }
              else if (local_368.smallend.vect[1] == 2) {
                uVar29 = (int)aoStack_1a8._0_4_ >> 1;
                if (-1 < lVar50) {
                  uVar29 = (uint)aoStack_1a8._0_4_ >> 1;
                }
              }
              else if (lVar50 < 0) {
                uVar29 = ~((int)~aoStack_1a8._0_4_ / local_368.smallend.vect[1]);
              }
              else {
                uVar29 = (int)aoStack_1a8._0_4_ / local_368.smallend.vect[1];
              }
            }
            iStack_1ac = uVar27;
            aoStack_1a8._0_4_ = uVar29;
            if (local_368.smallend.vect[2] != 1) {
              if (local_368.smallend.vect[2] == 4) {
                uVar44 = (int)aoStack_1a8._4_4_ >> 2;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar44 = (uint)aoStack_1a8._4_4_ >> 2;
                }
              }
              else if (local_368.smallend.vect[2] == 2) {
                uVar44 = (int)aoStack_1a8._4_4_ >> 1;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar44 = (uint)aoStack_1a8._4_4_ >> 1;
                }
              }
              else if ((int)aoStack_1a8._4_4_ < 0) {
                uVar44 = ~((int)~aoStack_1a8._4_4_ / local_368.smallend.vect[2]);
              }
              else {
                uVar44 = (int)aoStack_1a8._4_4_ / local_368.smallend.vect[2];
              }
            }
          }
          else {
            local_248.smallend.vect[0] = 0;
            local_248.smallend.vect[1] = 0;
            local_248.smallend.vect[2] = 0;
            lVar48 = 0;
            do {
              if ((((uint)(undefined4)auStack_1a0[0] >> ((uint)lVar48 & 0x1f) & 1) != 0) &&
                 ((&iStack_1ac)[lVar48] % local_368.smallend.vect[lVar48] != 0)) {
                local_248.smallend.vect[lVar48] = 1;
              }
              lVar48 = lVar48 + 1;
            } while (lVar48 != 3);
            uVar44 = iStack_1ac;
            if (local_368.smallend.vect[0] != 1) {
              if (local_368.smallend.vect[0] == 4) {
                uVar44 = iStack_1ac >> 2;
                if (-1 < lVar31) {
                  uVar44 = (uint)iStack_1ac >> 2;
                }
              }
              else if (local_368.smallend.vect[0] == 2) {
                uVar44 = iStack_1ac >> 1;
                if (-1 < lVar31) {
                  uVar44 = (uint)iStack_1ac >> 1;
                }
              }
              else if (lVar31 < 0) {
                uVar44 = ~(~iStack_1ac / local_368.smallend.vect[0]);
              }
              else {
                uVar44 = iStack_1ac / local_368.smallend.vect[0];
              }
            }
            uVar27 = aoStack_1a8._0_4_;
            if (local_368.smallend.vect[1] != 1) {
              if (local_368.smallend.vect[1] == 4) {
                uVar27 = (int)aoStack_1a8._0_4_ >> 2;
                if (-1 < lVar50) {
                  uVar27 = (uint)aoStack_1a8._0_4_ >> 2;
                }
              }
              else if (local_368.smallend.vect[1] == 2) {
                uVar27 = (int)aoStack_1a8._0_4_ >> 1;
                if (-1 < lVar50) {
                  uVar27 = (uint)aoStack_1a8._0_4_ >> 1;
                }
              }
              else if (lVar50 < 0) {
                uVar27 = ~((int)~aoStack_1a8._0_4_ / local_368.smallend.vect[1]);
              }
              else {
                uVar27 = (int)aoStack_1a8._0_4_ / local_368.smallend.vect[1];
              }
            }
            uVar29 = aoStack_1a8._4_4_;
            if (local_368.smallend.vect[2] != 1) {
              if (local_368.smallend.vect[2] == 4) {
                uVar29 = (int)aoStack_1a8._4_4_ >> 2;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar29 = (uint)aoStack_1a8._4_4_ >> 2;
                }
              }
              else if (local_368.smallend.vect[2] == 2) {
                uVar29 = (int)aoStack_1a8._4_4_ >> 1;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar29 = (uint)aoStack_1a8._4_4_ >> 1;
                }
              }
              else if ((int)aoStack_1a8._4_4_ < 0) {
                uVar29 = ~((int)~aoStack_1a8._4_4_ / local_368.smallend.vect[2]);
              }
              else {
                uVar29 = (int)aoStack_1a8._4_4_ / local_368.smallend.vect[2];
              }
            }
            iStack_1ac = uVar44 + local_248.smallend.vect[0];
            aoStack_1a8._0_4_ = uVar27 + local_248.smallend.vect[1];
            uVar44 = uVar29 + local_248.smallend.vect[2];
          }
        }
        aoStack_1a8._4_4_ = uVar44;
        bVar51 = Box::operator==((Box *)local_1b8,
                                 (Box *)((long)(a_geom->
                                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                               ).
                                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        local_2b8 + -0xe4));
        if (bVar51) break;
        piVar2 = (local_2f0->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + uVar33;
        *piVar2 = *piVar2 + 1;
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        emplace_back<amrex::Box_const&,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                   ((local_258->
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ).
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar45),(Box *)local_1b8,
                   (RealBox *)local_250,&local_2ac,&local_1e8);
        pVVar24 = local_320;
        std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
                  (&(local_320->
                    super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ).
                    super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar45].
                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                   (value_type *)
                   ((long)&(((local_2d8->
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                   local_268));
        BoxArray::coarsen((pVVar24->
                          super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          ).
                          super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar45].
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_finish + -1,&local_368.smallend);
        std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
        push_back(&(local_2f8->
                   super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar45].
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ,(value_type *)
                   ((long)&(((local_260->
                             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             ).
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + local_270));
        local_368.smallend.vect[1] = local_368.smallend.vect[1] * local_300._0_4_;
        local_368.smallend.vect[0] = local_368.smallend.vect[0] * local_318;
        local_368.smallend.vect[2] = local_368.smallend.vect[2] * local_2a8._0_4_;
        bVar51 = false;
      } while (bVar26);
      uVar44 = (this->info).hidden_direction;
      iVar39 = -(uVar44 - 3);
      if (2 < uVar44) {
        iVar39 = 0;
      }
      (this->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [local_2c0 - 2] = *(int *)((long)local_368.smallend.vect + (ulong)(uint)(iVar39 << 2));
      uVar33 = local_308;
    } while (2 < (long)local_2c0);
  }
  *(local_2f0->super_vector<int,_std::allocator<int>_>).
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
  pvVar9 = (vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
           (local_258->
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ).
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar32 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar6._M_current = *(Geometry **)(pvVar9 + 8);
  if (iVar6._M_current == *(Geometry **)(pvVar9 + 0x10)) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>(pvVar9,iVar6,pGVar32);
  }
  else {
    memcpy(iVar6._M_current,pGVar32,200);
    *(long *)(pvVar9 + 8) = *(long *)(pvVar9 + 8) + 200;
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::push_back
            (&((local_320->
               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             (local_2d8->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::push_back
            (&((local_2f8->
               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             (local_260->
             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>).
             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ppFVar7 = (local_1c0->
            super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ).
            super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar49 = (vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
             *)(local_1c8->
               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               ).
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(local_1c0->
            super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ).
            super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 < 1) {
    local_1b8._0_8_ = operator_new(8);
    ((FabFactory<amrex::FArrayBox> *)local_1b8._0_8_)->_vptr_FabFactory =
         (_func_int **)&PTR__FabFactory_00712918;
    std::
    vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
    ::
    emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
              (pvVar49,(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)local_1b8);
    if ((FabFactory<amrex::FArrayBox> *)local_1b8._0_8_ != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*(*(_func_int ***)local_1b8._0_8_)[1])();
    }
  }
  else {
    local_1b8._0_4_ = (*(*ppFVar7)->_vptr_FabFactory[5])();
    local_1b8._4_4_ = extraout_var_00;
    iVar10._M_current =
         *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           **)(pvVar49 + 8);
    if (iVar10._M_current ==
        *(unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          **)(pvVar49 + 0x10)) {
      std::
      vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
      ::_M_realloc_insert<amrex::FabFactory<amrex::FArrayBox>*>
                (pvVar49,iVar10,(FabFactory<amrex::FArrayBox> **)local_1b8);
    }
    else {
      ((iVar10._M_current)->_M_t).
      super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
           (FabFactory<amrex::FArrayBox> *)local_1b8._0_8_;
      *(long *)(pvVar49 + 8) = *(long *)(pvVar49 + 8) + 8;
    }
  }
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_domain_covered).super_vector<int,_std::allocator<int>_>,
             (long)this->m_num_amr_levels,(value_type_conflict *)local_1b8);
  uVar33 = BoxArray::numPts(*(BoxArray **)
                             &(((this->m_grids).
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
  ;
  pVVar43 = (this->m_geom).
            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  compactify((Box *)local_1b8,this,
             (Box *)(*(long *)&(pVVar43->
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                    + 0xac));
  puVar35 = (uint *)(this->m_domain_covered).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
  *puVar35 = (uint)(uVar33 ==
                   (long)((aoStack_1a8._4_4_ - local_1b8._8_4_) + 1) *
                   (long)((iStack_1ac - (int)local_1b8._0_8_) + 1) *
                   (long)((aoStack_1a8._0_4_ - SUB84(local_1b8._0_8_,4)) + 1));
  local_308 = uVar33;
  if ((1 < this->m_num_amr_levels) && (*puVar35 != 0)) {
    lVar31 = 2;
    lVar50 = 6;
    do {
      LVar34 = BoxArray::numPts(*(BoxArray **)
                                 ((long)&(((this->m_grids).
                                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ).
                                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar50 * 4));
      pVVar43 = (this->m_geom).
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      compactify((Box *)local_1b8,this,
                 (Box *)(*(long *)((long)&(pVVar43->
                                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                          ).
                                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar50 * 4) +
                        0xac));
      puVar35 = (uint *)(this->m_domain_covered).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      puVar35[lVar31 + -1] =
           (uint)(LVar34 ==
                 (long)((aoStack_1a8._4_4_ - local_1b8._8_4_) + 1) *
                 (long)((iStack_1ac - (int)local_1b8._0_8_) + 1) *
                 (long)((aoStack_1a8._0_4_ - SUB84(local_1b8._0_8_,4)) + 1));
      if (this->m_num_amr_levels <= lVar31) break;
      lVar50 = lVar50 + 6;
      lVar48 = lVar31 + -1;
      lVar31 = lVar31 + 1;
    } while (puVar35[lVar48] != 0);
  }
  local_248.smallend.vect._0_8_ = (FabFactory<amrex::FArrayBox> *)0x100000001;
  local_248.smallend.vect[2] = 1;
  local_248.bigend.vect[0] = 0;
  local_248.bigend.vect[1] = 0;
  local_248.bigend.vect[2] = 0;
  local_248.btype.itype = 0;
  bVar51 = true;
  if ((this->info).do_agglomeration == true) {
    if (*puVar35 == 0) {
      BoxArray::minimalBox
                (&local_248,
                 *(BoxArray **)
                  &(((local_320->
                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
      bVar51 = (long)((local_248.bigend.vect[2] - local_248.smallend.vect[2]) + 1) *
               (long)((local_248.bigend.vect[0] - local_248.smallend.vect[0]) + 1) *
               (long)((local_248.bigend.vect[1] - local_248.smallend.vect[1]) + 1) - local_308 != 0;
    }
    else {
      lVar31 = *(long *)&(pVVar43->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      auVar4 = *(undefined1 (*) [16])(lVar31 + 0xb8);
      local_248.bigend.vect[1] = auVar4._4_4_;
      local_248.bigend.vect[2] = auVar4._8_4_;
      local_248.btype.itype = auVar4._12_4_;
      local_248.smallend.vect._0_8_ = *(FabFactory<amrex::FArrayBox> **)(lVar31 + 0xac);
      local_248.smallend.vect[2] = (int)*(undefined8 *)(lVar31 + 0xb4);
      local_248.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar31 + 0xb4) >> 0x20);
      uVar33 = (ulong)(uint)(this->info).hidden_direction;
      if (uVar33 < 3) {
        this_00 = *(BATransformer **)
                   &(((this->m_grids).
                      super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
        BATransformer::operator()((Box *)local_1b8,this_00,(Box *)**(undefined8 **)(this_00 + 1));
        iVar39 = *(int *)(local_1b8 + (long)(this->info).hidden_direction * 4);
        local_248.smallend.vect[uVar33] = iVar39;
        local_248.bigend.vect[uVar33] = iVar39;
      }
      bVar51 = false;
    }
  }
  if ((((this->info).do_semicoarsening == true) && ((uint)(this->info).hidden_direction < 3)) ||
     (3 < (this->info).semicoarsening_direction + 1U)) {
    Assert_host("! (info.do_semicoarsening && info.hasHiddenDimension()) && info.semicoarsening_direction >= -1 && info.semicoarsening_direction < AMREX_SPACEDIM"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                ,299,(char *)0x0);
  }
  if (bVar51 || (this->info).do_agglomeration != true) {
    local_2a8 = 0.0;
    if ((this->info).do_consolidation == true) {
      dVar52 = BoxArray::d_numPts((local_2d8->
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      local_2a8 = dVar52 / (double)*(int *)(DAT_0071a620 + -0x38);
      if ((anonymous_namespace)::consolidation_threshold == -1) {
        iVar39 = (this->info).con_grid_size;
        (anonymous_namespace)::consolidation_threshold = iVar39 * iVar39 * iVar39;
      }
    }
    pGVar8 = (a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_348._M_head_impl = (FabFactory<amrex::FArrayBox> *)0x100000001;
    IStack_340.itype = 1;
    iVar39 = 0;
    if ((this->info).max_coarsening_level < 1) {
      local_2c0 = (ulong)local_2c0._4_4_ << 0x20;
      local_300 = 0.0;
    }
    else {
      local_318 = (uint)local_314;
      local_268 = CONCAT44(local_268._4_4_,local_314._4_4_);
      local_300 = 0.0;
      local_270 = CONCAT44(local_270._4_4_,local_30c);
      iVar30 = 0;
      iVar40 = 0;
      local_2c0 = (ulong)local_2c0._4_4_ << 0x20;
      while( true ) {
        local_308 = CONCAT44(local_308._4_4_,iVar30);
        local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,local_30c);
        local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start = local_314;
        local_2b8 = CONCAT44(local_2b8._4_4_,iVar40);
        bVar42 = iVar40 < (this->info).max_semicoarsening_level & (this->info).do_semicoarsening;
        if ((bVar42 == 1) && (lVar31 = (long)(this->info).semicoarsening_direction, lVar31 != -1)) {
          *(undefined4 *)
           ((long)&local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar31 * 4) = 1;
        }
        local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                              _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        lVar31 = 0;
        do {
          local_1b8._0_8_ =
               (_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                )0x100000001;
          local_1b8._8_4_ = 1;
          *(int *)(local_1b8 + lVar31 * 4) =
               *(int *)((long)&local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar31 * 4) *
               *(int *)((long)&local_348._M_head_impl + lVar31 * 4);
          bVar51 = Box::coarsenable(&pGVar8->domain,(IntVect *)local_1b8,&local_1dc);
          uVar44 = 0;
          if (bVar51) {
            bVar51 = BoxArray::coarsenable
                               ((local_2d8->
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start,(IntVect *)local_1b8,
                                &local_20c);
            uVar44 = (uint)bVar51;
          }
          *(uint *)((long)&local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar31 * 4) = uVar44;
          iVar30 = (this->info).semicoarsening_direction;
          if ((iVar30 == -1 & uVar44 == 0 & bVar42) == 1) {
            *(undefined4 *)
             ((long)&local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar31 * 4) = 1;
            *(undefined4 *)
             ((long)&local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar31 * 4) = 1;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 3);
        if ((((int)local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start != 1) ||
            (local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_ != 1)) ||
           ((int)local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish != 1)) break;
        if (((int)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish == 1 &&
             (local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ == 1 &&
             (uint)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start == 1)) ||
           (((bVar42 & iVar30 == -1) == 1 &&
            (1 < (byte)(((int)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                              _M_impl.super__Vector_impl_data._M_finish == 1) +
                       (local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ == 1) +
                       ((uint)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                              _M_impl.super__Vector_impl_data._M_start == 1)))))) break;
        bVar51 = (int)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish != (int)local_270;
        bVar26 = local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_ != (int)local_268;
        bVar20 = (uint)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start != local_318;
        iVar30 = (uint)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start * (uint)local_348._M_head_impl;
        local_348._M_head_impl._4_4_ =
             local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_ * local_348._M_head_impl._4_4_;
        local_348._M_head_impl._0_4_ = iVar30;
        IStack_340.itype =
             IStack_340.itype *
             (int)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pvVar9 = (vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                 (local_258->
                 super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var22._M_t.
        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
             *(tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               *)(pGVar8->domain).smallend.vect;
        lVar31 = *(long *)((pGVar8->domain).smallend.vect + 2);
        auVar3 = *(undefined1 (*) [12])&(pGVar8->domain).bigend;
        uVar5 = (pGVar8->domain).btype;
        aoStack_1a8._0_4_ = auVar3._4_4_;
        aoStack_1a8._4_4_ = auVar3._8_4_;
        auStack_1a0[0]._0_4_ = uVar5;
        local_1b8._8_4_ = (undefined4)lVar31;
        iStack_1ac = (int)((ulong)lVar31 >> 0x20);
        local_1b8._4_4_ =
             _Var22._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl._4_4_
        ;
        IVar28.itype = local_1b8._4_4_;
        uVar44 = aoStack_1a8._4_4_;
        if (local_348._M_head_impl._4_4_ == 1 && iVar30 == 1) {
          local_1b8._0_8_ =
               _Var22._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
          if (IStack_340.itype != 1) goto LAB_0053c050;
        }
        else {
          local_1b8._0_4_ =
               _Var22._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl.
               _0_4_;
          if (iVar30 != 1) {
            if (iVar30 == 4) {
              if ((int)local_1b8._0_4_ < 0) {
                local_1b8._0_4_ = (int)local_1b8._0_4_ >> 2;
              }
              else {
                local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 2;
              }
            }
            else if (iVar30 == 2) {
              if ((int)local_1b8._0_4_ < 0) {
                local_1b8._0_4_ = (int)local_1b8._0_4_ >> 1;
              }
              else {
                local_1b8._0_4_ = (uint)local_1b8._0_4_ >> 1;
              }
            }
            else if ((int)local_1b8._0_4_ < 0) {
              local_1b8._0_4_ = ~((int)~local_1b8._0_4_ / iVar30);
            }
            else {
              local_1b8._0_4_ = (int)local_1b8._0_4_ / iVar30;
            }
          }
          if (local_348._M_head_impl._4_4_ != 1) {
            if (local_348._M_head_impl._4_4_ == 4) {
              if ((long)_Var22._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl < 0) {
                IVar28.itype = (int)local_1b8._4_4_ >> 2;
              }
              else {
                IVar28.itype = (uint)local_1b8._4_4_ >> 2;
              }
            }
            else if (local_348._M_head_impl._4_4_ == 2) {
              if ((long)_Var22._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl < 0) {
                IVar28.itype = (int)local_1b8._4_4_ >> 1;
              }
              else {
                IVar28.itype = (uint)local_1b8._4_4_ >> 1;
              }
            }
            else if ((long)_Var22._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl < 0) {
              IVar28.itype = ~((int)~local_1b8._4_4_ / (int)local_348._M_head_impl._4_4_);
            }
            else {
              IVar28.itype = (int)local_1b8._4_4_ / local_348._M_head_impl._4_4_;
            }
          }
LAB_0053c050:
          local_1b8._4_4_ = IVar28.itype;
          if (IStack_340.itype != 1) {
            if (IStack_340.itype == 4) {
              if ((int)local_1b8._8_4_ < 0) {
                local_1b8._8_4_ = (int)local_1b8._8_4_ >> 2;
              }
              else {
                local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 2;
              }
            }
            else if (IStack_340.itype == 2) {
              if ((int)local_1b8._8_4_ < 0) {
                local_1b8._8_4_ = (int)local_1b8._8_4_ >> 1;
              }
              else {
                local_1b8._8_4_ = (uint)local_1b8._8_4_ >> 1;
              }
            }
            else if ((int)local_1b8._8_4_ < 0) {
              local_1b8._8_4_ = ~((int)~local_1b8._8_4_ / IStack_340.itype);
            }
            else {
              local_1b8._8_4_ = (int)local_1b8._8_4_ / (int)IStack_340.itype;
            }
          }
          if ((undefined4)auStack_1a0[0] == 0) {
            uVar27 = iStack_1ac;
            if (iVar30 != 1) {
              if (iVar30 == 4) {
                uVar27 = iStack_1ac >> 2;
                if (-1 < lVar31) {
                  uVar27 = (uint)iStack_1ac >> 2;
                }
              }
              else if (iVar30 == 2) {
                uVar27 = iStack_1ac >> 1;
                if (-1 < lVar31) {
                  uVar27 = (uint)iStack_1ac >> 1;
                }
              }
              else if (lVar31 < 0) {
                uVar27 = ~(~iStack_1ac / iVar30);
              }
              else {
                uVar27 = iStack_1ac / iVar30;
              }
            }
            uVar29 = aoStack_1a8._0_4_;
            if (local_348._M_head_impl._4_4_ != 1) {
              if (local_348._M_head_impl._4_4_ == 4) {
                uVar29 = (int)aoStack_1a8._0_4_ >> 2;
                if (-1 < (int)aoStack_1a8._0_4_) {
                  uVar29 = (uint)aoStack_1a8._0_4_ >> 2;
                }
              }
              else if (local_348._M_head_impl._4_4_ == 2) {
                uVar29 = (int)aoStack_1a8._0_4_ >> 1;
                if (-1 < (int)aoStack_1a8._0_4_) {
                  uVar29 = (uint)aoStack_1a8._0_4_ >> 1;
                }
              }
              else if ((int)aoStack_1a8._0_4_ < 0) {
                uVar29 = ~((int)~aoStack_1a8._0_4_ / (int)local_348._M_head_impl._4_4_);
              }
              else {
                uVar29 = (int)aoStack_1a8._0_4_ / (int)local_348._M_head_impl._4_4_;
              }
            }
            iStack_1ac = uVar27;
            aoStack_1a8._0_4_ = uVar29;
            if (IStack_340.itype != 1) {
              if (IStack_340.itype == 4) {
                uVar44 = (int)aoStack_1a8._4_4_ >> 2;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar44 = (uint)aoStack_1a8._4_4_ >> 2;
                }
              }
              else if (IStack_340.itype == 2) {
                uVar44 = (int)aoStack_1a8._4_4_ >> 1;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar44 = (uint)aoStack_1a8._4_4_ >> 1;
                }
              }
              else if ((int)aoStack_1a8._4_4_ < 0) {
                uVar44 = ~((int)~aoStack_1a8._4_4_ / IStack_340.itype);
              }
              else {
                uVar44 = (int)aoStack_1a8._4_4_ / IStack_340.itype;
              }
            }
          }
          else {
            local_368.smallend.vect._0_8_ = (pointer)0x0;
            local_368.smallend.vect[2] = 0;
            lVar50 = 0;
            do {
              if ((((uint)(undefined4)auStack_1a0[0] >> ((uint)lVar50 & 0x1f) & 1) != 0) &&
                 ((&iStack_1ac)[lVar50] % *(int *)((long)&local_348._M_head_impl + lVar50 * 4) != 0)
                 ) {
                local_368.smallend.vect[lVar50] = 1;
              }
              lVar50 = lVar50 + 1;
            } while (lVar50 != 3);
            uVar44 = iStack_1ac;
            if (iVar30 != 1) {
              if (iVar30 == 4) {
                uVar44 = iStack_1ac >> 2;
                if (-1 < lVar31) {
                  uVar44 = (uint)iStack_1ac >> 2;
                }
              }
              else if (iVar30 == 2) {
                uVar44 = iStack_1ac >> 1;
                if (-1 < lVar31) {
                  uVar44 = (uint)iStack_1ac >> 1;
                }
              }
              else if (lVar31 < 0) {
                uVar44 = ~(~iStack_1ac / iVar30);
              }
              else {
                uVar44 = iStack_1ac / iVar30;
              }
            }
            uVar27 = aoStack_1a8._0_4_;
            if (local_348._M_head_impl._4_4_ != 1) {
              if (local_348._M_head_impl._4_4_ == 4) {
                uVar27 = (int)aoStack_1a8._0_4_ >> 2;
                if (-1 < (int)aoStack_1a8._0_4_) {
                  uVar27 = (uint)aoStack_1a8._0_4_ >> 2;
                }
              }
              else if (local_348._M_head_impl._4_4_ == 2) {
                uVar27 = (int)aoStack_1a8._0_4_ >> 1;
                if (-1 < (int)aoStack_1a8._0_4_) {
                  uVar27 = (uint)aoStack_1a8._0_4_ >> 1;
                }
              }
              else if ((int)aoStack_1a8._0_4_ < 0) {
                uVar27 = ~((int)~aoStack_1a8._0_4_ / (int)local_348._M_head_impl._4_4_);
              }
              else {
                uVar27 = (int)aoStack_1a8._0_4_ / (int)local_348._M_head_impl._4_4_;
              }
            }
            uVar29 = aoStack_1a8._4_4_;
            if (IStack_340.itype != 1) {
              if (IStack_340.itype == 4) {
                uVar29 = (int)aoStack_1a8._4_4_ >> 2;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar29 = (uint)aoStack_1a8._4_4_ >> 2;
                }
              }
              else if (IStack_340.itype == 2) {
                uVar29 = (int)aoStack_1a8._4_4_ >> 1;
                if (-1 < (int)aoStack_1a8._4_4_) {
                  uVar29 = (uint)aoStack_1a8._4_4_ >> 1;
                }
              }
              else if ((int)aoStack_1a8._4_4_ < 0) {
                uVar29 = ~((int)~aoStack_1a8._4_4_ / IStack_340.itype);
              }
              else {
                uVar29 = (int)aoStack_1a8._4_4_ / IStack_340.itype;
              }
            }
            iStack_1ac = uVar44 + local_368.smallend.vect[0];
            aoStack_1a8._0_4_ = uVar27 + local_368.smallend.vect[1];
            uVar44 = uVar29 + local_368.smallend.vect[2];
          }
        }
        aoStack_1a8._4_4_ = uVar44;
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        emplace_back<amrex::Box,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                  (pvVar9,(Box *)local_1b8,(RealBox *)local_250,&local_2ac,&local_1e8);
        pvVar11 = &((local_320->
                    super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ).
                    super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
        amrex::coarsen((BoxArray *)local_1b8,
                       (local_2d8->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start,(IntVect *)&local_348);
        std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::
        emplace_back<amrex::BoxArray>(pvVar11,(BoxArray *)local_1b8);
        BoxArray::~BoxArray((BoxArray *)local_1b8);
        if ((this->info).do_consolidation == true) {
          pvVar12 = &((local_2f8->
                      super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
          ;
          pDVar13 = (pvVar12->
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if ((double)(anonymous_namespace)::consolidation_threshold * 0.999 <=
              local_2a8 /
              (double)(int)(local_348._M_head_impl._4_4_ * (uint)local_348._M_head_impl *
                           IStack_340.itype)) {
            std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
            push_back(pvVar12,pDVar13 + -1);
          }
          else {
            pDVar14 = (pvVar12->
                      super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            DistributionMapping::DistributionMapping((DistributionMapping *)local_1b8);
            std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
            emplace_back<amrex::DistributionMapping>(pvVar12,(DistributionMapping *)local_1b8);
            uVar36 = extraout_RAX;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(iStack_1ac,local_1b8._8_4_)
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(iStack_1ac,local_1b8._8_4_));
              uVar36 = extraout_RAX_00;
            }
            local_300 = (double)CONCAT71((int7)((ulong)uVar36 >> 8),1);
            local_2c0 = CONCAT44(local_2c0._4_4_,(int)((ulong)((long)pDVar13 - (long)pDVar14) >> 4))
            ;
          }
        }
        else {
          std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          push_back(&((local_2f8->
                      super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ,(local_260->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ).
                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar40 = (int)local_2b8 + (uint)(bVar51 || (bVar26 || bVar20));
        iVar30 = (int)local_308 + 1;
        if ((this->info).max_coarsening_level <= iVar30) break;
      }
    }
    bVar51 = false;
    iVar30 = (int)local_2c0;
  }
  else {
    lVar31 = *(long *)&(((this->m_geom).
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_368.smallend.vect._0_8_ = *(ulong *)(lVar31 + 0xac);
    local_368._20_8_ = *(undefined8 *)(lVar31 + 0xc0);
    local_368.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar31 + 0xb8) >> 0x20);
    local_368.smallend.vect[2] = (int)*(undefined8 *)(lVar31 + 0xb4);
    local_368.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar31 + 0xb4) >> 0x20);
    IStack_330.itype = local_248.btype.itype;
    auStack_33c[2] = local_248.bigend.vect[2];
    auStack_33c[1] = local_248.bigend.vect[1];
    local_348._M_head_impl = (FabFactory<amrex::FArrayBox> *)local_248.smallend.vect._0_8_;
    IStack_340.itype = local_248.smallend.vect[2];
    auStack_33c[0] = local_248.bigend.vect[0];
    plVar15 = *(long **)(*(long *)&(((this->m_grids).
                                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                        + 0x48);
    lVar50 = plVar15[1];
    lVar48 = *plVar15;
    iVar39 = (this->info).agg_grid_size;
    local_1b8._0_8_ =
         ((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           *)(lVar31 + 0xac))->_M_t;
    aoStack_1a8._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar31 + 0xb8) >> 0x20);
    aoStack_1a8._4_4_ = (undefined4)*(undefined8 *)(lVar31 + 0xc0);
    auStack_1a0[0]._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar31 + 0xc0) >> 0x20);
    local_1b8._8_4_ = (undefined4)*(undefined8 *)(lVar31 + 0xb4);
    iStack_1ac = (int)((ulong)*(undefined8 *)(lVar31 + 0xb4) >> 0x20);
    __l._M_len = 1;
    __l._M_array = (iterator)local_1b8;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
              (&local_2a0,__l,(allocator_type *)&local_288);
    aoStack_1a8[0] = (ostringstream)(undefined1)auStack_33c[1];
    aoStack_1a8[1] = (ostringstream)auStack_33c[1]._1_1_;
    aoStack_1a8[2] = (ostringstream)auStack_33c[1]._2_1_;
    aoStack_1a8[3] = (ostringstream)auStack_33c[1]._3_1_;
    aoStack_1a8._4_4_ = (undefined4)stack0xfffffffffffffccc;
    auStack_1a0[0]._0_4_ = SUB84(stack0xfffffffffffffccc,4);
    local_1b8._0_8_ = local_348._M_head_impl;
    local_1b8._8_4_ = IStack_340.itype;
    iStack_1ac = auStack_33c[0];
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_1b8;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
              (&local_288,__l_00,(allocator_type *)&local_200);
    local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_1b8;
    std::vector<int,_std::allocator<int>_>::vector(&local_200,__l_01,(allocator_type *)&local_228);
    local_1b8._0_8_ =
         (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )0x100000001;
    local_1b8._8_4_ = 1;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_1b8;
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              (&local_228,__l_02,(allocator_type *)&local_2e8);
    if (0 < (this->info).max_coarsening_level) {
      local_300 = (double)((lVar50 - lVar48 >> 2) * 0x6db6db6db6db6db7);
      local_268 = CONCAT44(local_268._4_4_,(uint)local_314);
      local_270 = CONCAT44(local_270._4_4_,local_314._4_4_);
      local_318 = local_30c;
      local_2a8 = (double)(iVar39 * iVar39 * iVar39) * 0.999;
      uVar33 = 0;
      iVar39 = 0;
      while( true ) {
        local_2e8.vect[2] = local_30c;
        local_2e8.vect._0_8_ = local_314;
        local_308 = uVar33;
        bVar42 = (int)uVar33 < (this->info).max_semicoarsening_level &
                 (this->info).do_semicoarsening;
        if ((bVar42 == 1) && (lVar31 = (long)(this->info).semicoarsening_direction, lVar31 != -1)) {
          local_2e8.vect[lVar31] = 1;
        }
        local_2cc.vect[0] = 0;
        local_2cc.vect[1] = 0;
        local_2cc.vect[2] = 0;
        lVar31 = 0;
        do {
          local_1b8._0_8_ =
               (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                )0x100000001;
          local_1b8._8_4_ = 1;
          *(int *)(local_1b8 + lVar31 * 4) = local_2e8.vect[lVar31];
          bVar51 = Box::coarsenable(&local_368,(IntVect *)local_1b8,&local_1dc);
          uVar44 = 0;
          if (bVar51) {
            bVar51 = Box::coarsenable((Box *)&local_348,(IntVect *)local_1b8,&local_20c);
            uVar44 = (uint)bVar51;
          }
          local_2cc.vect[lVar31] = uVar44;
          iVar30 = (this->info).semicoarsening_direction;
          if ((iVar30 == -1 & uVar44 == 0 & bVar42) == 1) {
            local_2cc.vect[lVar31] = 1;
            local_2e8.vect[lVar31] = 1;
          }
          iVar40 = local_2e8.vect[2];
          lVar31 = lVar31 + 1;
        } while (lVar31 != 3);
        if (((local_2cc.vect[0] != 1) || (local_2cc.vect[1] != 1)) || (local_2cc.vect[2] != 1))
        break;
        iVar46 = local_2e8.vect[0];
        iVar47 = local_2e8.vect[1];
        bVar51 = local_2e8.vect[1] == 1;
        bVar26 = local_2e8.vect[0] == 1;
        if (((bVar51 && bVar26) && local_2e8.vect[2] == 1) ||
           (((bVar42 & iVar30 == -1) == 1 &&
            (1 < (byte)((local_2e8.vect[2] == 1U) +
                       (local_2e8.vect[1] == 1) + (local_2e8.vect[0] == 1)))))) break;
        local_2b8 = CONCAT71(local_2b8._1_7_,
                             local_2e8.vect[2] != local_318 ||
                             (local_2e8.vect[1] != (int)local_270 ||
                             local_2e8.vect[0] != (int)local_268));
        local_1b8._8_4_ =
             local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].vect[2] * local_2e8.vect[2];
        local_1b8._4_4_ =
             local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].vect[1] * local_2e8.vect[1];
        local_1b8._0_4_ =
             local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].vect[0] * local_2e8.vect[0];
        if (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
          _M_realloc_insert<amrex::IntVect>
                    (&local_228,
                     (iterator)
                     local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(IntVect *)local_1b8);
        }
        else {
          (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish)->vect[2] = local_1b8._8_4_;
          *(undefined8 *)
           (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish)->vect = local_1b8._0_8_;
          local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        uVar36 = local_368.smallend.vect._0_8_;
        uVar44 = local_368.smallend.vect[1];
        if (bVar51 && bVar26) {
          if (iVar40 != 1) goto LAB_0053c8af;
        }
        else {
          if (iVar46 != 1) {
            if (iVar46 == 4) {
              if (local_368.smallend.vect[0] < 0) {
                local_368.smallend.vect[0] = local_368.smallend.vect[0] >> 2;
              }
              else {
                local_368.smallend.vect[0] = (uint)local_368.smallend.vect[0] >> 2;
              }
            }
            else if (iVar46 == 2) {
              if (local_368.smallend.vect[0] < 0) {
                local_368.smallend.vect[0] = local_368.smallend.vect[0] >> 1;
              }
              else {
                local_368.smallend.vect[0] = (uint)local_368.smallend.vect[0] >> 1;
              }
            }
            else if (local_368.smallend.vect[0] < 0) {
              local_368.smallend.vect[0] = ~(~local_368.smallend.vect[0] / iVar46);
            }
            else {
              local_368.smallend.vect[0] = local_368.smallend.vect[0] / iVar46;
            }
          }
          if (iVar47 != 1) {
            if (iVar47 == 4) {
              if ((long)uVar36 < 0) {
                uVar44 = local_368.smallend.vect[1] >> 2;
              }
              else {
                uVar44 = (uint)local_368.smallend.vect[1] >> 2;
              }
            }
            else if (iVar47 == 2) {
              if ((long)uVar36 < 0) {
                uVar44 = local_368.smallend.vect[1] >> 1;
              }
              else {
                uVar44 = (uint)local_368.smallend.vect[1] >> 1;
              }
            }
            else if ((long)uVar36 < 0) {
              uVar44 = ~(~local_368.smallend.vect[1] / iVar47);
            }
            else {
              uVar44 = local_368.smallend.vect[1] / iVar47;
            }
          }
LAB_0053c8af:
          local_368.smallend.vect[1] = uVar44;
          if (iVar40 != 1) {
            if (iVar40 == 4) {
              if (local_368.smallend.vect[2] < 0) {
                local_368.smallend.vect[2] = local_368.smallend.vect[2] >> 2;
              }
              else {
                local_368.smallend.vect[2] = (uint)local_368.smallend.vect[2] >> 2;
              }
            }
            else if (iVar40 == 2) {
              if (local_368.smallend.vect[2] < 0) {
                local_368.smallend.vect[2] = local_368.smallend.vect[2] >> 1;
              }
              else {
                local_368.smallend.vect[2] = (uint)local_368.smallend.vect[2] >> 1;
              }
            }
            else if (local_368.smallend.vect[2] < 0) {
              local_368.smallend.vect[2] = ~(~local_368.smallend.vect[2] / iVar40);
            }
            else {
              local_368.smallend.vect[2] = local_368.smallend.vect[2] / iVar40;
            }
          }
          if (local_368.btype.itype == 0) {
            uVar44 = local_368.bigend.vect[0];
            if (iVar46 != 1) {
              if (iVar46 == 4) {
                uVar44 = local_368.bigend.vect[0] >> 2;
                if (-1 < local_368.bigend.vect[0]) {
                  uVar44 = (uint)local_368.bigend.vect[0] >> 2;
                }
              }
              else if (iVar46 == 2) {
                uVar44 = local_368.bigend.vect[0] >> 1;
                if (-1 < local_368.bigend.vect[0]) {
                  uVar44 = (uint)local_368.bigend.vect[0] >> 1;
                }
              }
              else if (local_368.bigend.vect[0] < 0) {
                uVar44 = ~(~local_368.bigend.vect[0] / iVar46);
              }
              else {
                uVar44 = local_368.bigend.vect[0] / iVar46;
              }
            }
            local_368.bigend.vect[0] = uVar44;
            uVar44 = local_368.bigend.vect[1];
            if (iVar47 != 1) {
              if (iVar47 == 4) {
                uVar44 = local_368.bigend.vect[1] >> 2;
                if (-1 < local_368.bigend.vect[1]) {
                  uVar44 = (uint)local_368.bigend.vect[1] >> 2;
                }
              }
              else if (iVar47 == 2) {
                uVar44 = local_368.bigend.vect[1] >> 1;
                if (-1 < local_368.bigend.vect[1]) {
                  uVar44 = (uint)local_368.bigend.vect[1] >> 1;
                }
              }
              else if (local_368.bigend.vect[1] < 0) {
                uVar44 = ~(~local_368.bigend.vect[1] / iVar47);
              }
              else {
                uVar44 = local_368.bigend.vect[1] / iVar47;
              }
            }
            local_368.bigend.vect[1] = uVar44;
            uVar44 = local_368.bigend.vect[2];
            if (iVar40 != 1) {
              if (iVar40 == 4) {
                uVar44 = local_368.bigend.vect[2] >> 2;
                if (-1 < local_368.bigend.vect[2]) {
                  uVar44 = (uint)local_368.bigend.vect[2] >> 2;
                }
              }
              else if (iVar40 == 2) {
                uVar44 = local_368.bigend.vect[2] >> 1;
                if (-1 < local_368.bigend.vect[2]) {
                  uVar44 = (uint)local_368.bigend.vect[2] >> 1;
                }
              }
              else if (local_368.bigend.vect[2] < 0) {
                uVar44 = ~(~local_368.bigend.vect[2] / iVar40);
              }
              else {
                uVar44 = local_368.bigend.vect[2] / iVar40;
              }
            }
          }
          else {
            local_1b8._0_8_ = (FabFactory<amrex::FArrayBox> *)0x0;
            local_1b8._8_4_ = 0;
            lVar31 = 0;
            do {
              if (((local_368.btype.itype >> ((uint)lVar31 & 0x1f) & 1) != 0) &&
                 (local_368.bigend.vect[lVar31] % local_2e8.vect[lVar31] != 0)) {
                *(undefined4 *)(local_1b8 + lVar31 * 4) = 1;
              }
              lVar31 = lVar31 + 1;
            } while (lVar31 != 3);
            uVar44 = local_368.bigend.vect[0];
            if (iVar46 != 1) {
              if (iVar46 == 4) {
                uVar44 = local_368.bigend.vect[0] >> 2;
                if (-1 < local_368.bigend.vect[0]) {
                  uVar44 = (uint)local_368.bigend.vect[0] >> 2;
                }
              }
              else if (iVar46 == 2) {
                uVar44 = local_368.bigend.vect[0] >> 1;
                if (-1 < local_368.bigend.vect[0]) {
                  uVar44 = (uint)local_368.bigend.vect[0] >> 1;
                }
              }
              else if (local_368.bigend.vect[0] < 0) {
                uVar44 = ~(~local_368.bigend.vect[0] / iVar46);
              }
              else {
                uVar44 = local_368.bigend.vect[0] / iVar46;
              }
            }
            uVar27 = local_368.bigend.vect[1];
            if (iVar47 != 1) {
              if (iVar47 == 4) {
                uVar27 = local_368.bigend.vect[1] >> 2;
                if (-1 < local_368.bigend.vect[1]) {
                  uVar27 = (uint)local_368.bigend.vect[1] >> 2;
                }
              }
              else if (iVar47 == 2) {
                uVar27 = local_368.bigend.vect[1] >> 1;
                if (-1 < local_368.bigend.vect[1]) {
                  uVar27 = (uint)local_368.bigend.vect[1] >> 1;
                }
              }
              else if (local_368.bigend.vect[1] < 0) {
                uVar27 = ~(~local_368.bigend.vect[1] / iVar47);
              }
              else {
                uVar27 = local_368.bigend.vect[1] / iVar47;
              }
            }
            uVar29 = local_368.bigend.vect[2];
            if (iVar40 != 1) {
              if (iVar40 == 4) {
                uVar29 = local_368.bigend.vect[2] >> 2;
                if (-1 < local_368.bigend.vect[2]) {
                  uVar29 = (uint)local_368.bigend.vect[2] >> 2;
                }
              }
              else if (iVar40 == 2) {
                uVar29 = local_368.bigend.vect[2] >> 1;
                if (-1 < local_368.bigend.vect[2]) {
                  uVar29 = (uint)local_368.bigend.vect[2] >> 1;
                }
              }
              else if (local_368.bigend.vect[2] < 0) {
                uVar29 = ~(~local_368.bigend.vect[2] / iVar40);
              }
              else {
                uVar29 = local_368.bigend.vect[2] / iVar40;
              }
            }
            local_368.bigend.vect[0] = uVar44 + local_1b8._0_4_;
            local_368.bigend.vect[1] = uVar27 + local_1b8._4_4_;
            uVar44 = uVar29 + local_1b8._8_4_;
          }
          local_368.bigend.vect[2] = uVar44;
        }
        if (local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_2a0,
                     (iterator)
                     local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_368);
        }
        else {
          *(ulong *)((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish)->bigend).vect =
               CONCAT44(local_368.bigend.vect[1],local_368.bigend.vect[0]);
          *(undefined8 *)
           (((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish)->bigend).vect + 2) = local_368._20_8_;
          *(undefined8 *)
           ((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish)->smallend).vect = local_368.smallend.vect._0_8_;
          *(ulong *)(((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_finish)->smallend).vect + 2) =
               CONCAT44(local_368.bigend.vect[0],local_368.smallend.vect[2]);
          local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        _Var23._M_head_impl = local_348._M_head_impl;
        uVar44 = local_348._M_head_impl._4_4_;
        if (bVar51 && bVar26) {
          if (iVar40 != 1) goto LAB_0053cb5e;
        }
        else {
          if (iVar46 != 1) {
            if (iVar46 == 4) {
              if ((int)(uint)local_348._M_head_impl < 0) {
                local_348._M_head_impl._0_4_ = (int)(uint)local_348._M_head_impl >> 2;
              }
              else {
                local_348._M_head_impl._0_4_ = (uint)local_348._M_head_impl >> 2;
              }
            }
            else if (iVar46 == 2) {
              if ((int)(uint)local_348._M_head_impl < 0) {
                local_348._M_head_impl._0_4_ = (int)(uint)local_348._M_head_impl >> 1;
              }
              else {
                local_348._M_head_impl._0_4_ = (uint)local_348._M_head_impl >> 1;
              }
            }
            else if ((int)(uint)local_348._M_head_impl < 0) {
              local_348._M_head_impl._0_4_ = ~((int)~(uint)local_348._M_head_impl / iVar46);
            }
            else {
              local_348._M_head_impl._0_4_ = (int)(uint)local_348._M_head_impl / iVar46;
            }
          }
          if (iVar47 != 1) {
            if (iVar47 == 4) {
              if ((long)_Var23._M_head_impl < 0) {
                uVar44 = (int)local_348._M_head_impl._4_4_ >> 2;
              }
              else {
                uVar44 = local_348._M_head_impl._4_4_ >> 2;
              }
            }
            else if (iVar47 == 2) {
              if ((long)_Var23._M_head_impl < 0) {
                uVar44 = (int)local_348._M_head_impl._4_4_ >> 1;
              }
              else {
                uVar44 = local_348._M_head_impl._4_4_ >> 1;
              }
            }
            else if ((long)_Var23._M_head_impl < 0) {
              uVar44 = ~((int)~local_348._M_head_impl._4_4_ / iVar47);
            }
            else {
              uVar44 = (int)local_348._M_head_impl._4_4_ / iVar47;
            }
          }
LAB_0053cb5e:
          local_348._M_head_impl._4_4_ = uVar44;
          if (iVar40 != 1) {
            if (iVar40 == 4) {
              if ((int)IStack_340.itype < 0) {
                IStack_340.itype = IStack_340.itype >> 2;
              }
              else {
                IStack_340.itype = IStack_340.itype >> 2;
              }
            }
            else if (iVar40 == 2) {
              if ((int)IStack_340.itype < 0) {
                IStack_340.itype = IStack_340.itype >> 1;
              }
              else {
                IStack_340.itype = IStack_340.itype >> 1;
              }
            }
            else if ((int)IStack_340.itype < 0) {
              IStack_340.itype = ~((int)~IStack_340.itype / iVar40);
            }
            else {
              IStack_340.itype = IStack_340.itype / iVar40;
            }
          }
          if (IStack_330.itype == 0) {
            uVar44 = auStack_33c[0];
            if (iVar46 != 1) {
              if (iVar46 == 4) {
                uVar44 = (int)auStack_33c[0] >> 2;
                if (-1 < (int)auStack_33c[0]) {
                  uVar44 = auStack_33c[0] >> 2;
                }
              }
              else if (iVar46 == 2) {
                uVar44 = (int)auStack_33c[0] >> 1;
                if (-1 < (int)auStack_33c[0]) {
                  uVar44 = auStack_33c[0] >> 1;
                }
              }
              else if ((int)auStack_33c[0] < 0) {
                uVar44 = ~((int)~auStack_33c[0] / iVar46);
              }
              else {
                uVar44 = (int)auStack_33c[0] / iVar46;
              }
            }
            auStack_33c[0] = uVar44;
            uVar44 = auStack_33c[1];
            if (iVar47 != 1) {
              if (iVar47 == 4) {
                uVar44 = (int)auStack_33c[1] >> 2;
                if (-1 < (int)auStack_33c[1]) {
                  uVar44 = auStack_33c[1] >> 2;
                }
              }
              else if (iVar47 == 2) {
                uVar44 = (int)auStack_33c[1] >> 1;
                if (-1 < (int)auStack_33c[1]) {
                  uVar44 = auStack_33c[1] >> 1;
                }
              }
              else if ((int)auStack_33c[1] < 0) {
                uVar44 = ~((int)~auStack_33c[1] / iVar47);
              }
              else {
                uVar44 = (int)auStack_33c[1] / iVar47;
              }
            }
            auStack_33c[1] = uVar44;
            uVar44 = auStack_33c[2];
            if (iVar40 != 1) {
              if (iVar40 == 4) {
                uVar44 = (int)auStack_33c[2] >> 2;
                if (-1 < (int)auStack_33c[2]) {
                  uVar44 = auStack_33c[2] >> 2;
                }
              }
              else if (iVar40 == 2) {
                uVar44 = (int)auStack_33c[2] >> 1;
                if (-1 < (int)auStack_33c[2]) {
                  uVar44 = auStack_33c[2] >> 1;
                }
              }
              else if ((int)auStack_33c[2] < 0) {
                uVar44 = ~((int)~auStack_33c[2] / iVar40);
              }
              else {
                uVar44 = (int)auStack_33c[2] / iVar40;
              }
            }
          }
          else {
            local_1b8._0_8_ = (FabFactory<amrex::FArrayBox> *)0x0;
            local_1b8._8_4_ = 0;
            lVar31 = 0;
            do {
              if (((IStack_330.itype >> ((uint)lVar31 & 0x1f) & 1) != 0) &&
                 ((int)auStack_33c[lVar31] % local_2e8.vect[lVar31] != 0)) {
                *(undefined4 *)(local_1b8 + lVar31 * 4) = 1;
              }
              lVar31 = lVar31 + 1;
            } while (lVar31 != 3);
            uVar44 = auStack_33c[0];
            if (iVar46 != 1) {
              if (iVar46 == 4) {
                uVar44 = (int)auStack_33c[0] >> 2;
                if (-1 < (int)auStack_33c[0]) {
                  uVar44 = auStack_33c[0] >> 2;
                }
              }
              else if (iVar46 == 2) {
                uVar44 = (int)auStack_33c[0] >> 1;
                if (-1 < (int)auStack_33c[0]) {
                  uVar44 = auStack_33c[0] >> 1;
                }
              }
              else if ((int)auStack_33c[0] < 0) {
                uVar44 = ~((int)~auStack_33c[0] / iVar46);
              }
              else {
                uVar44 = (int)auStack_33c[0] / iVar46;
              }
            }
            uVar27 = auStack_33c[1];
            if (iVar47 != 1) {
              if (iVar47 == 4) {
                uVar27 = (int)auStack_33c[1] >> 2;
                if (-1 < (int)auStack_33c[1]) {
                  uVar27 = auStack_33c[1] >> 2;
                }
              }
              else if (iVar47 == 2) {
                uVar27 = (int)auStack_33c[1] >> 1;
                if (-1 < (int)auStack_33c[1]) {
                  uVar27 = auStack_33c[1] >> 1;
                }
              }
              else if ((int)auStack_33c[1] < 0) {
                uVar27 = ~((int)~auStack_33c[1] / iVar47);
              }
              else {
                uVar27 = (int)auStack_33c[1] / iVar47;
              }
            }
            uVar29 = auStack_33c[2];
            if (iVar40 != 1) {
              if (iVar40 == 4) {
                uVar29 = (int)auStack_33c[2] >> 2;
                if (-1 < (int)auStack_33c[2]) {
                  uVar29 = auStack_33c[2] >> 2;
                }
              }
              else if (iVar40 == 2) {
                uVar29 = (int)auStack_33c[2] >> 1;
                if (-1 < (int)auStack_33c[2]) {
                  uVar29 = auStack_33c[2] >> 1;
                }
              }
              else if ((int)auStack_33c[2] < 0) {
                uVar29 = ~((int)~auStack_33c[2] / iVar40);
              }
              else {
                uVar29 = (int)auStack_33c[2] / iVar40;
              }
            }
            auStack_33c[0] = uVar44 + local_1b8._0_4_;
            auStack_33c[1] = uVar27 + local_1b8._4_4_;
            uVar44 = uVar29 + local_1b8._8_4_;
          }
          auStack_33c[2] = uVar44;
        }
        if (local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_288,
                     (iterator)
                     local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish,(Box *)&local_348);
        }
        else {
          *(ulong *)((local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish)->bigend).vect =
               CONCAT44(auStack_33c[1],auStack_33c[0]);
          *(undefined8 *)
           (((local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish)->bigend).vect + 2) = stack0xfffffffffffffccc;
          *(FabFactory<amrex::FArrayBox> **)
           ((local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish)->smallend).vect = local_348._M_head_impl;
          *(ulong *)(((local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_finish)->smallend).vect + 2) =
               CONCAT44(auStack_33c[0],IStack_340.itype);
          local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar44 = CONCAT31(0,((double)(int)((auStack_33c[2] - IStack_340.itype) + 1) *
                            (double)(int)((auStack_33c[1] -
                                          (int)((ulong)local_348._M_head_impl >> 0x20)) + 1) *
                            (double)(int)((auStack_33c[0] - (int)local_348._M_head_impl) + 1)) /
                            local_300 < local_2a8);
        local_1b8._0_4_ = uVar44;
        if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_200,
                     (iterator)
                     local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_1b8);
        }
        else {
          *local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = uVar44;
          local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar33 = (ulong)((int)local_308 + (uint)(byte)local_2b8);
        iVar39 = iVar39 + 1;
        if ((this->info).max_coarsening_level <= iVar39) break;
      }
    }
    uVar44 = (int)((long)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    iVar39 = 0;
    bVar51 = false;
    if (1 < (int)uVar44) {
      bVar51 = false;
      uVar33 = 1;
      iVar39 = 0;
      do {
        if ((bVar51) ||
           (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar33] != 0)) {
LAB_0053d0a1:
          local_2e8.vect[2] =
               ((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33 - 1].bigend.vect[2] -
                local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start[uVar33 - 1].smallend.vect[2]) + 1) /
               ((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33].bigend.vect[2] -
                local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start[uVar33].smallend.vect[2]) + 1);
          local_2e8.vect._0_8_ =
               (long)((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar33 - 1].bigend.vect[1] -
                      local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar33 - 1].smallend.vect[1]) + 1) /
               (long)((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar33].bigend.vect[1] -
                      local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar33].smallend.vect[1]) + 1) << 0x20 |
               (long)((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar33 - 1].bigend.vect[0] -
                      local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar33 - 1].smallend.vect[0]) + 1) /
               (long)((local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar33].bigend.vect[0] -
                      local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar33].smallend.vect[0]) + 1) & 0xffffffffU;
          bVar26 = BoxArray::coarsenable
                             ((((local_320->
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ).
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_finish + -1,&local_2e8,1);
          if (!bVar26) break;
          std::vector<amrex::BoxArray,std::allocator<amrex::BoxArray>>::emplace_back<amrex::Box&>
                    ((vector<amrex::BoxArray,std::allocator<amrex::BoxArray>> *)
                     (local_320->
                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar33);
          local_2cc.vect[1] = (this->info).agg_grid_size;
          local_2cc.vect[0] = local_2cc.vect[1];
          local_2cc.vect[2] = local_2cc.vect[1];
          if ((((this->info).do_semicoarsening == true) &&
              ((long)uVar33 <= (long)(this->info).max_semicoarsening_level)) &&
             (lVar31 = (long)(this->info).semicoarsening_direction, lVar31 != -1)) {
            local_1b8._0_8_ =
                 *(undefined8 *)
                  local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar33].smallend.vect;
            uVar36 = *(undefined8 *)
                      local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar33].bigend.vect;
            uVar21 = *(undefined8 *)
                      (local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar33].bigend.vect + 2);
            uVar25 = local_1b8._0_8_;
            local_1b8._8_4_ =
                 (undefined4)
                 *(undefined8 *)
                  (local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar33].smallend.vect + 2);
            iStack_1ac = (int)uVar36;
            aoStack_1a8._0_4_ = (undefined4)((ulong)uVar36 >> 0x20);
            aoStack_1a8._4_4_ = (undefined4)uVar21;
            auStack_1a0[0]._0_4_ = (undefined4)((ulong)uVar21 >> 0x20);
            lVar50 = 0;
            do {
              if (((uint)(undefined4)auStack_1a0[0] >> ((uint)lVar50 & 0x1f) & 1) != 0) {
                (&iStack_1ac)[lVar50] = (&iStack_1ac)[lVar50] + -1;
              }
              lVar50 = lVar50 + 1;
            } while (lVar50 != 3);
            iVar40 = (iStack_1ac - local_1b8._0_4_) + 1;
            local_1b8._4_4_ = (undefined4)((ulong)local_1b8._0_8_ >> 0x20);
            iVar46 = (aoStack_1a8._0_4_ - local_1b8._4_4_) + 1;
            iVar47 = (aoStack_1a8._4_4_ - local_1b8._8_4_) + 1;
            iVar30 = local_2cc.vect[1] + -1;
            local_1b8._0_8_ = uVar25;
            local_2cc.vect[lVar31] =
                 ((iVar30 + iVar46) / iVar46) * ((iVar30 + iVar40) / iVar40) *
                 ((iVar30 + iVar47) / iVar47) * local_2cc.vect[lVar31];
          }
          BoxArray::maxSize((((local_320->
                              super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              ).
                              super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -1,&local_2cc);
          pvVar12 = &((local_2f8->
                      super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
          ;
          DistributionMapping::DistributionMapping((DistributionMapping *)local_1b8);
          std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          emplace_back<amrex::DistributionMapping>(pvVar12,(DistributionMapping *)local_1b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(iStack_1ac,local_1b8._8_4_)
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(iStack_1ac,local_1b8._8_4_));
          }
          if (!bVar51) {
            iVar39 = (int)uVar33;
            bVar51 = true;
          }
        }
        else {
          bVar26 = BoxArray::coarsenable
                             ((local_2d8->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              local_228.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar33,&local_20c);
          if (!bVar26) goto LAB_0053d0a1;
          pvVar11 = &((local_320->
                      super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
          amrex::coarsen((BoxArray *)local_1b8,
                         (local_2d8->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                         ).super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_228.
                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar33);
          std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::
          emplace_back<amrex::BoxArray>(pvVar11,(BoxArray *)local_1b8);
          BoxArray::~BoxArray((BoxArray *)local_1b8);
          std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          push_back(&((local_2f8->
                      super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ,(local_260->
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ).
                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        emplace_back<amrex::Box&,amrex::RealBox_const&,int_const&,std::array<int,3ul>const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)
                   (local_258->
                   super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar33,(RealBox *)local_250,&local_2ac,
                   &local_1e8);
        uVar33 = uVar33 + 1;
      } while (uVar33 != (uVar44 & 0x7fffffff));
    }
    if (local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_228.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar30 = 0;
    local_300 = 0.0;
  }
  pVVar16 = (local_320->
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ).
            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar40 = (int)((ulong)((long)(pVVar16->
                               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        *(long *)&(pVVar16->
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                        ) >> 3) * -0x3b13b13b;
  *(local_2f0->super_vector<int,_std::allocator<int>_>).
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = iVar40;
  if (1 < iVar40) {
    lVar31 = 0x188;
    lVar50 = 0;
    do {
      lVar48 = *(long *)&(((this->m_geom).
                           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_1b8._8_4_ =
           ((*(int *)(lVar48 + -200 + lVar31) - *(int *)(lVar48 + -0xd4 + lVar31)) + 1) /
           ((*(int *)(lVar48 + lVar31) - *(int *)(lVar48 + -0xc + lVar31)) + 1);
      local_1b8._0_8_ =
           (long)((*(int *)(lVar48 + -0xcc + lVar31) - *(int *)(lVar48 + -0xd8 + lVar31)) + 1) /
           (long)((*(int *)(lVar48 + -4 + lVar31) - *(int *)(lVar48 + -0x10 + lVar31)) + 1) << 0x20
           | (long)((*(int *)(lVar48 + -0xd0 + lVar31) - *(int *)(lVar48 + -0xdc + lVar31)) + 1) /
             (long)((*(int *)(lVar48 + -8 + lVar31) - *(int *)(lVar48 + -0x14 + lVar31)) + 1) &
             0xffffffffU;
      iVar17._M_current =
           (this->mg_coarsen_ratio_vec).
           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar17._M_current ==
          (this->mg_coarsen_ratio_vec).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
          .super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
        _M_realloc_insert<amrex::IntVect>
                  (&(this->mg_coarsen_ratio_vec).
                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,iVar17,
                   (IntVect *)local_1b8);
      }
      else {
        (iVar17._M_current)->vect[2] = local_1b8._8_4_;
        *(undefined8 *)(iVar17._M_current)->vect = local_1b8._0_8_;
        ppIVar1 = &(this->mg_coarsen_ratio_vec).
                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      lVar50 = lVar50 + 1;
      lVar31 = lVar31 + 200;
    } while (lVar50 < (long)*(local_2f0->super_vector<int,_std::allocator<int>_>).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + -1);
  }
  iVar40 = this->m_num_amr_levels;
  if (0 < iVar40) {
    lVar31 = 0;
    pVVar41 = local_1d0;
    do {
      if (((pVVar41->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           [lVar31] == 4) &&
         (iVar17._M_current =
               (this->mg_coarsen_ratio_vec).
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_finish,
         iVar17._M_current ==
         (this->mg_coarsen_ratio_vec).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
         super__Vector_impl_data._M_start)) {
        local_1b8._0_8_ = (FabFactory<amrex::FArrayBox> *)0x200000002;
        local_1b8._8_4_ = 2;
        if (iVar17._M_current ==
            (this->mg_coarsen_ratio_vec).
            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::
          _M_realloc_insert<amrex::IntVect>
                    (&(this->mg_coarsen_ratio_vec).
                      super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,iVar17,
                     (IntVect *)local_1b8);
          pVVar41 = local_1d0;
        }
        else {
          (iVar17._M_current)->vect[2] = 2;
          (iVar17._M_current)->vect[0] = 2;
          (iVar17._M_current)->vect[1] = 2;
          ppIVar1 = &(this->mg_coarsen_ratio_vec).
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        iVar40 = this->m_num_amr_levels;
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < iVar40);
  }
  dVar52 = local_300;
  if (bVar51) {
    makeAgglomeratedDMap
              ((local_320->
               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (local_2f8->
               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    dVar52 = local_300;
LAB_0053d5ed:
    this->m_bottom_comm = this->m_default_comm;
    this->m_do_agglomeration = bVar51;
    this->m_do_consolidation = (bool)(SUB81(dVar52,0) & 1);
    if ((anonymous_namespace)::flag_verbose_linop == 0) goto LAB_0053d8bb;
    if (bVar51) {
      poVar37 = OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      local_1b8._8_4_ = SUB84(poVar37,0);
      iStack_1ac = (int)((ulong)poVar37 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      *(undefined8 *)
       ((long)auStack_1a0 + *(long *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18)) =
           *(undefined8 *)
            ((long)CONCAT44(iStack_1ac,local_1b8._8_4_) +
            *(long *)(*(long *)CONCAT44(iStack_1ac,local_1b8._8_4_) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,
                 "MLLinOp::defineGrids(): agglomerated AMR level 0 starting at MG level ",0x46);
      std::ostream::operator<<(aoStack_1a8,iVar39);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," of ",4);
      std::ostream::operator<<
                (aoStack_1a8,
                 *(local_2f0->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start);
      cVar19 = (char)aoStack_1a8;
      std::ios::widen((char)*(undefined8 *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18) +
                      cVar19);
      std::ostream::put(cVar19);
      std::ostream::flush();
    }
    else {
      if (((ulong)dVar52 & 1) == 0) goto LAB_0053d81d;
      poVar37 = OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      local_1b8._8_4_ = SUB84(poVar37,0);
      iStack_1ac = (int)((ulong)poVar37 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      *(undefined8 *)
       ((long)auStack_1a0 + *(long *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18)) =
           *(undefined8 *)
            ((long)CONCAT44(iStack_1ac,local_1b8._8_4_) +
            *(long *)(*(long *)CONCAT44(iStack_1ac,local_1b8._8_4_) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,
                 "MLLinOp::defineGrids(): consolidated AMR level 0 starting at MG level ",0x46);
      std::ostream::operator<<(aoStack_1a8,iVar30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," of ",4);
      std::ostream::operator<<
                (aoStack_1a8,
                 *(local_2f0->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," (ratio = ",10);
      std::ostream::operator<<(aoStack_1a8,(anonymous_namespace)::consolidation_ratio);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,")",1);
      cVar19 = (char)aoStack_1a8;
      std::ios::widen((char)*(undefined8 *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18) +
                      cVar19);
      std::ostream::put(cVar19);
      std::ostream::flush();
    }
  }
  else {
    if (((ulong)local_300 & 1) != 0) {
      makeConsolidatedDMap
                ((local_320->
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (local_2f8->
                 super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ).
                 super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (anonymous_namespace)::consolidation_ratio,
                 (anonymous_namespace)::consolidation_strategy);
      goto LAB_0053d5ed;
    }
    this->m_bottom_comm = this->m_default_comm;
    this->m_do_agglomeration = false;
    this->m_do_consolidation = false;
    if ((anonymous_namespace)::flag_verbose_linop == 0) goto LAB_0053d8bb;
LAB_0053d81d:
    poVar37 = OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
    local_1b8._8_4_ = SUB84(poVar37,0);
    iStack_1ac = (int)((ulong)poVar37 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    *(undefined8 *)
     ((long)auStack_1a0 + *(long *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18)) =
         *(undefined8 *)
          ((long)CONCAT44(iStack_1ac,local_1b8._8_4_) +
          *(long *)(*(long *)CONCAT44(iStack_1ac,local_1b8._8_4_) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,
               "MLLinOp::defineGrids(): no agglomeration or consolidation of AMR level 0",0x48);
    cVar19 = (char)aoStack_1a8;
    std::ios::widen((char)*(undefined8 *)(CONCAT44(aoStack_1a8._4_4_,aoStack_1a8._0_4_) + -0x18) +
                    cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
  }
  Print::~Print((Print *)local_1b8);
LAB_0053d8bb:
  iVar39 = this->m_num_amr_levels;
  if (0 < iVar39) {
    piVar38 = (local_2f0->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    uVar33 = 0;
    do {
      if (1 < piVar38[uVar33]) {
        uVar45 = 1;
        do {
          pVVar18 = (this->m_factory).
                    super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (*this->_vptr_MLLinOp[0x42])
                    ((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)local_1b8,this,uVar33 & 0xffffffff,uVar45);
          std::
          vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
          ::
          emplace_back<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>
                    ((vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>,std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>>>
                      *)(pVVar18 + uVar33),
                     (unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)local_1b8);
          if ((FabFactory<amrex::FArrayBox> *)local_1b8._0_8_ != (FabFactory<amrex::FArrayBox> *)0x0
             ) {
            (*(*(_func_int ***)local_1b8._0_8_)[1])();
          }
          uVar44 = (int)uVar45 + 1;
          uVar45 = (ulong)uVar44;
          piVar38 = (local_2f0->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
        } while ((int)uVar44 < piVar38[uVar33]);
        iVar39 = this->m_num_amr_levels;
      }
      uVar33 = uVar33 + 1;
    } while ((long)uVar33 < (long)iVar39);
  }
  return;
}

Assistant:

void
MLLinOp::defineGrids (const Vector<Geometry>& a_geom,
                      const Vector<BoxArray>& a_grids,
                      const Vector<DistributionMapping>& a_dmap,
                      const Vector<FabFactory<FArrayBox> const*>& a_factory)
{
    BL_PROFILE("MLLinOp::defineGrids()");

    m_num_amr_levels = a_geom.size();

    m_amr_ref_ratio.resize(m_num_amr_levels);
    m_num_mg_levels.resize(m_num_amr_levels);

    m_geom.resize(m_num_amr_levels);
    m_grids.resize(m_num_amr_levels);
    m_dmap.resize(m_num_amr_levels);
    m_factory.resize(m_num_amr_levels);

    m_default_comm = ParallelContext::CommunicatorSub();

    const RealBox& rb = a_geom[0].ProbDomain();
    const int coord = a_geom[0].Coord();
    const Array<int,AMREX_SPACEDIM>& is_per = a_geom[0].isPeriodic();

    IntVect mg_coarsen_ratio_v(mg_coarsen_ratio);
    IntVect mg_box_min_width_v(mg_box_min_width);
    IntVect mg_domain_min_width_v(mg_domain_min_width);
    if (hasHiddenDimension()) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMREX_SPACEDIM == 3 && m_num_amr_levels == 1,
                                         "Hidden direction only supported for 3d level solve");
        mg_coarsen_ratio_v[info.hidden_direction] = 1;
        mg_box_min_width_v[info.hidden_direction] = 0;
        mg_domain_min_width_v[info.hidden_direction] = 0;
    }

    // fine amr levels
    for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev)
    {
        m_num_mg_levels[amrlev] = 1;
        m_geom[amrlev].push_back(a_geom[amrlev]);
        m_grids[amrlev].push_back(a_grids[amrlev]);
        m_dmap[amrlev].push_back(a_dmap[amrlev]);
        if (amrlev < a_factory.size()) {
            m_factory[amrlev].emplace_back(a_factory[amrlev]->clone());
        } else {
            m_factory[amrlev].push_back(std::make_unique<FArrayBoxFactory>());
        }

        IntVect rr = mg_coarsen_ratio_v;
        const Box& dom = a_geom[amrlev].Domain();
        for (int i = 0; i < 2; ++i)
        {
            if (!dom.coarsenable(rr)) amrex::Abort("MLLinOp: Uncoarsenable domain");

            const Box& cdom = amrex::coarsen(dom,rr);
            if (cdom == a_geom[amrlev-1].Domain()) break;

            ++(m_num_mg_levels[amrlev]);

            m_geom[amrlev].emplace_back(cdom, rb, coord, is_per);

            m_grids[amrlev].push_back(a_grids[amrlev]);
            AMREX_ASSERT(m_grids[amrlev].back().coarsenable(rr));
            m_grids[amrlev].back().coarsen(rr);

            m_dmap[amrlev].push_back(a_dmap[amrlev]);

            rr *= mg_coarsen_ratio_v;
        }

        if (hasHiddenDimension()) {
            m_amr_ref_ratio[amrlev-1] = rr[AMREX_SPACEDIM-info.hidden_direction];
        } else {
            m_amr_ref_ratio[amrlev-1] = rr[0];
        }
    }

    // coarsest amr level
    m_num_mg_levels[0] = 1;
    m_geom[0].push_back(a_geom[0]);
    m_grids[0].push_back(a_grids[0]);
    m_dmap[0].push_back(a_dmap[0]);
    if (a_factory.size() > 0) {
        m_factory[0].emplace_back(a_factory[0]->clone());
    } else {
        m_factory[0].push_back(std::make_unique<FArrayBoxFactory>());
    }

    m_domain_covered.resize(m_num_amr_levels, false);
    auto npts0 = m_grids[0][0].numPts();
    m_domain_covered[0] = (npts0 == compactify(m_geom[0][0].Domain()).numPts());
    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        if (!m_domain_covered[amrlev-1]) break;
        m_domain_covered[amrlev] = (m_grids[amrlev][0].numPts() ==
                                    compactify(m_geom[amrlev][0].Domain()).numPts());
    }

    Box aggbox;
    bool aggable = false;

    if (info.do_agglomeration)
    {
        if (m_domain_covered[0])
        {
            aggbox = m_geom[0][0].Domain();
            if (hasHiddenDimension()) {
                aggbox.makeSlab(hiddenDirection(), m_grids[0][0][0].smallEnd(hiddenDirection()));
            }
            aggable = true;
        }
        else
        {
            aggbox = m_grids[0][0].minimalBox();
            aggable = (aggbox.numPts() == npts0);
        }
    }

    bool agged = false;
    bool coned = false;
    int agg_lev = 0, con_lev = 0;

    AMREX_ALWAYS_ASSERT( ! (info.do_semicoarsening && info.hasHiddenDimension())
                         && info.semicoarsening_direction >= -1
                         && info.semicoarsening_direction < AMREX_SPACEDIM );

    if (info.do_agglomeration && aggable)
    {
        Box dbx = m_geom[0][0].Domain();
        Box bbx = aggbox;
        Real const nbxs = static_cast<Real>(m_grids[0][0].size());
        Real const threshold_npts = static_cast<Real>(AMREX_D_TERM(info.agg_grid_size,
                                                                  *info.agg_grid_size,
                                                                  *info.agg_grid_size));
        Vector<Box> domainboxes{dbx};
        Vector<Box> boundboxes{bbx};
        Vector<int> agg_flag{false};
        Vector<IntVect> accum_coarsen_ratio{IntVect(1)};
        int numsclevs = 0;

        for (int lev = 0; lev < info.max_coarsening_level; ++lev)
        {
            IntVect rr_level = mg_coarsen_ratio_v;
            bool const do_semicoarsening_level = info.do_semicoarsening
                && numsclevs < info.max_semicoarsening_level;
            if (do_semicoarsening_level
                && info.semicoarsening_direction != -1)
            {
                rr_level[info.semicoarsening_direction] = 1;
            }
            IntVect is_coarsenable;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                IntVect rr_dir(1);
                rr_dir[idim] = rr_level[idim];
                is_coarsenable[idim] = dbx.coarsenable(rr_dir, mg_domain_min_width_v)
                    && bbx.coarsenable(rr_dir, mg_box_min_width_v);
                if (!is_coarsenable[idim] && do_semicoarsening_level
                    && info.semicoarsening_direction == -1)
                {
                    is_coarsenable[idim] = true;
                    rr_level[idim] = 1;
                }
            }
            if (is_coarsenable != IntVect(1) || rr_level == IntVect(1)) {
                break;
            }
            if (do_semicoarsening_level && info.semicoarsening_direction == -1) {
                // make sure there is at most one direction that is not coarsened
                int n_ones = AMREX_D_TERM(  static_cast<int>(rr_level[0] == 1),
                                          + static_cast<int>(rr_level[1] == 1),
                                          + static_cast<int>(rr_level[2] == 1));
                if (n_ones > 1) { break; }
            }
            if (rr_level != mg_coarsen_ratio_v) {
                ++numsclevs;
            }

            accum_coarsen_ratio.push_back(accum_coarsen_ratio.back()*rr_level);
            domainboxes.push_back(dbx.coarsen(rr_level));
            boundboxes.push_back(bbx.coarsen(rr_level));
            bool to_agg = (bbx.d_numPts() / nbxs) < 0.999*threshold_npts;
            agg_flag.push_back(to_agg);
        }

        for (int lev = 1, nlevs = domainboxes.size(); lev < nlevs; ++lev) {
            if (!agged && !agg_flag[lev] &&
                a_grids[0].coarsenable(accum_coarsen_ratio[lev], mg_box_min_width_v))
            {
                m_grids[0].push_back(amrex::coarsen(a_grids[0], accum_coarsen_ratio[lev]));
                m_dmap[0].push_back(a_dmap[0]);
            } else {
                IntVect cr = domainboxes[lev-1].length() / domainboxes[lev].length();
                if (!m_grids[0].back().coarsenable(cr)) {
                    break; // average_down would fail if fine boxarray is not coarsenable.
                }
                m_grids[0].emplace_back(boundboxes[lev]);
                IntVect max_grid_size(info.agg_grid_size);
                if (info.do_semicoarsening && info.max_semicoarsening_level >= lev
                    && info.semicoarsening_direction != -1)
                {
                    IntVect blen = amrex::enclosedCells(boundboxes[lev]).size();
                    AMREX_D_TERM(int mgs_0 = (max_grid_size[0]+blen[0]-1) / blen[0];,
                                 int mgs_1 = (max_grid_size[1]+blen[1]-1) / blen[1];,
                                 int mgs_2 = (max_grid_size[2]+blen[2]-1) / blen[2]);
                    max_grid_size[info.semicoarsening_direction]
                        *= AMREX_D_TERM(mgs_0, *mgs_1, *mgs_2);
                }
                m_grids[0].back().maxSize(max_grid_size);
                m_dmap[0].push_back(DistributionMapping());
                if (!agged) {
                    agged = true;
                    agg_lev = lev;
                }
            }
            m_geom[0].emplace_back(domainboxes[lev],rb,coord,is_per);
        }
    }
    else
    {
        Real avg_npts = 0.0;
        if (info.do_consolidation) {
            avg_npts = static_cast<Real>(a_grids[0].d_numPts()) / static_cast<Real>(ParallelContext::NProcsSub());
            if (consolidation_threshold == -1) {
                consolidation_threshold = AMREX_D_TERM(info.con_grid_size,
                                                      *info.con_grid_size,
                                                      *info.con_grid_size);
            }
        }

        Box const& dom0 = a_geom[0].Domain();
        IntVect rr_vec(1);
        int numsclevs = 0;
        for (int lev = 0; lev < info.max_coarsening_level; ++lev)
        {
            IntVect rr_level = mg_coarsen_ratio_v;
            bool do_semicoarsening_level = info.do_semicoarsening
                && numsclevs < info.max_semicoarsening_level;
            if (do_semicoarsening_level
                && info.semicoarsening_direction != -1)
            {
                rr_level[info.semicoarsening_direction] = 1;
            }
            IntVect is_coarsenable;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                IntVect rr_dir(1);
                rr_dir[idim] = rr_vec[idim] * rr_level[idim];
                is_coarsenable[idim] = dom0.coarsenable(rr_dir, mg_domain_min_width_v)
                    && a_grids[0].coarsenable(rr_dir, mg_box_min_width_v);
                if (!is_coarsenable[idim] && do_semicoarsening_level
                    && info.semicoarsening_direction == -1)
                {
                    is_coarsenable[idim] = true;
                    rr_level[idim] = 1;
                }
            }
            if (is_coarsenable != IntVect(1) || rr_level == IntVect(1)) {
                break;
            }
            if (do_semicoarsening_level && info.semicoarsening_direction == -1) {
                // make sure there is at most one direction that is not coarsened
                int n_ones = AMREX_D_TERM(  static_cast<int>(rr_level[0] == 1),
                                          + static_cast<int>(rr_level[1] == 1),
                                          + static_cast<int>(rr_level[2] == 1));
                if (n_ones > 1) { break; }
            }
            if (rr_level != mg_coarsen_ratio_v) {
                ++numsclevs;
            }
            rr_vec *= rr_level;

            m_geom[0].emplace_back(amrex::coarsen(dom0, rr_vec), rb, coord, is_per);
            m_grids[0].push_back(amrex::coarsen(a_grids[0], rr_vec));

            if (info.do_consolidation)
            {
                if (avg_npts/(AMREX_D_TERM(rr_vec[0], *rr_vec[1], *rr_vec[2]))
                    < Real(0.999)*consolidation_threshold)
                {
                    coned = true;
                    con_lev = m_dmap[0].size();
                    m_dmap[0].push_back(DistributionMapping());
                }
                else
                {
                    m_dmap[0].push_back(m_dmap[0].back());
                }
            }
            else
            {
                m_dmap[0].push_back(a_dmap[0]);
            }
        }
    }

    m_num_mg_levels[0] = m_grids[0].size();

    for (int mglev = 0; mglev < m_num_mg_levels[0] - 1; mglev++){
        const Box& fine_domain = m_geom[0][mglev].Domain();
        const Box& crse_domain = m_geom[0][mglev+1].Domain();
        mg_coarsen_ratio_vec.push_back(fine_domain.length()/crse_domain.length());
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        if (AMRRefRatio(amrlev) == 4 && mg_coarsen_ratio_vec.size() == 0) {
            mg_coarsen_ratio_vec.push_back(IntVect(2));
        }
    }

    if (agged)
    {
        makeAgglomeratedDMap(m_grids[0], m_dmap[0]);
    }
    else if (coned)
    {
        makeConsolidatedDMap(m_grids[0], m_dmap[0], consolidation_ratio, consolidation_strategy);
    }

    if (flag_use_mota && (agged || coned))
    {
        remapNeighborhoods(m_dmap[0]);
    }

    if (agged || coned)
    {
        m_bottom_comm = makeSubCommunicator(m_dmap[0].back());
    }
    else
    {
        m_bottom_comm = m_default_comm;
    }

    m_do_agglomeration = agged;
    m_do_consolidation = coned;

    if (flag_verbose_linop) {
        if (agged) {
            Print() << "MLLinOp::defineGrids(): agglomerated AMR level 0 starting at MG level "
                    << agg_lev << " of " << m_num_mg_levels[0] << std::endl;
        } else if (coned) {
            Print() << "MLLinOp::defineGrids(): consolidated AMR level 0 starting at MG level "
                    << con_lev << " of " << m_num_mg_levels[0]
                    << " (ratio = " << consolidation_ratio << ")" << std::endl;
        } else {
            Print() << "MLLinOp::defineGrids(): no agglomeration or consolidation of AMR level 0" << std::endl;
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 1; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_factory[amrlev].emplace_back(makeFactory(amrlev,mglev));
        }
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        AMREX_ASSERT_WITH_MESSAGE(m_grids[amrlev][0].coarsenable(m_amr_ref_ratio[amrlev-1]),
                                  "MLLinOp: grids not coarsenable between AMR levels");
    }
}